

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Skeleton_blocker_complex.h
# Opt level: O0

void __thiscall
Gudhi::skeleton_blocker::
Skeleton_blocker_complex<Gudhi::skeleton_blocker::Skeleton_blocker_simple_traits>::remove_blockers
          (Skeleton_blocker_complex<Gudhi::skeleton_blocker::Skeleton_blocker_simple_traits> *this)

{
  bool bVar1;
  pointer ppVar2;
  _Rb_tree_iterator<std::pair<const_Gudhi::skeleton_blocker::Skeleton_blocker_simple_traits::Vertex_handle,_Gudhi::skeleton_blocker::Skeleton_blocker_simplex<Gudhi::skeleton_blocker::Skeleton_blocker_simple_traits::Vertex_handle>_*>_>
  local_18;
  Skeleton_blocker_complex<Gudhi::skeleton_blocker::Skeleton_blocker_simple_traits> *local_10;
  Skeleton_blocker_complex<Gudhi::skeleton_blocker::Skeleton_blocker_simple_traits> *this_local;
  
  local_10 = this;
  while( true ) {
    bVar1 = std::
            multimap<Gudhi::skeleton_blocker::Skeleton_blocker_simple_traits::Vertex_handle,_Gudhi::skeleton_blocker::Skeleton_blocker_simplex<Gudhi::skeleton_blocker::Skeleton_blocker_simple_traits::Vertex_handle>_*,_std::less<Gudhi::skeleton_blocker::Skeleton_blocker_simple_traits::Vertex_handle>,_std::allocator<std::pair<const_Gudhi::skeleton_blocker::Skeleton_blocker_simple_traits::Vertex_handle,_Gudhi::skeleton_blocker::Skeleton_blocker_simplex<Gudhi::skeleton_blocker::Skeleton_blocker_simple_traits::Vertex_handle>_*>_>_>
            ::empty(&this->blocker_map_);
    if (((bVar1 ^ 0xffU) & 1) == 0) break;
    local_18._M_node =
         (_Base_ptr)
         std::
         multimap<Gudhi::skeleton_blocker::Skeleton_blocker_simple_traits::Vertex_handle,_Gudhi::skeleton_blocker::Skeleton_blocker_simplex<Gudhi::skeleton_blocker::Skeleton_blocker_simple_traits::Vertex_handle>_*,_std::less<Gudhi::skeleton_blocker::Skeleton_blocker_simple_traits::Vertex_handle>,_std::allocator<std::pair<const_Gudhi::skeleton_blocker::Skeleton_blocker_simple_traits::Vertex_handle,_Gudhi::skeleton_blocker::Skeleton_blocker_simplex<Gudhi::skeleton_blocker::Skeleton_blocker_simple_traits::Vertex_handle>_*>_>_>
         ::begin(&this->blocker_map_);
    ppVar2 = std::
             _Rb_tree_iterator<std::pair<const_Gudhi::skeleton_blocker::Skeleton_blocker_simple_traits::Vertex_handle,_Gudhi::skeleton_blocker::Skeleton_blocker_simplex<Gudhi::skeleton_blocker::Skeleton_blocker_simple_traits::Vertex_handle>_*>_>
             ::operator->(&local_18);
    delete_blocker(this,ppVar2->second);
  }
  this->num_blockers_ = 0;
  std::
  multimap<Gudhi::skeleton_blocker::Skeleton_blocker_simple_traits::Vertex_handle,_Gudhi::skeleton_blocker::Skeleton_blocker_simplex<Gudhi::skeleton_blocker::Skeleton_blocker_simple_traits::Vertex_handle>_*,_std::less<Gudhi::skeleton_blocker::Skeleton_blocker_simple_traits::Vertex_handle>,_std::allocator<std::pair<const_Gudhi::skeleton_blocker::Skeleton_blocker_simple_traits::Vertex_handle,_Gudhi::skeleton_blocker::Skeleton_blocker_simplex<Gudhi::skeleton_blocker::Skeleton_blocker_simple_traits::Vertex_handle>_*>_>_>
  ::clear(&this->blocker_map_);
  return;
}

Assistant:

void remove_blockers() {
    // Deallocate the blockers
    while (!blocker_map_.empty()) {
      delete_blocker(blocker_map_.begin()->second);
    }
    num_blockers_ = 0;
    blocker_map_.clear();
  }